

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DArrayShadowGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  Texture2DArray *pTVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  IVec2 local_18;
  
  fVar2 = c->in[0].m_data[3];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  pTVar1 = c->textures[0].tex2DArray;
  fVar3 = (float)pTVar1->m_width;
  r = c->in[0].m_data[2];
  fVar4 = (float)pTVar1->m_height;
  fVar3 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar3,c->in[1].m_data[1] * fVar4,
                     fVar3 * c->in[2].m_data[0],fVar4 * c->in[2].m_data[1]);
  local_18.m_data = *(int (*) [2])(p->offset).m_data;
  fVar2 = tcu::Texture2DArrayView::sampleCompareOffset
                    (&(c->textures[0].tex2DArray)->m_view,&c->textures[0].sampler,fVar2,s,t,r,fVar3,
                     &local_18);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

static void		evalTexture2DArrayShadowGradOffset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DArrayShadowOffset(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad2DArray(c), p.offset.swizzle(0,1)); }